

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
socketsys::SocketBindException::SocketBindException
          (SocketBindException *this,char *message,int error)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  char *pcStack_18;
  int error_local;
  char *message_local;
  SocketBindException *this_local;
  
  local_1c = error;
  pcStack_18 = message;
  message_local = (char *)this;
  std::__cxx11::to_string(&local_60,error);
  std::operator+(&local_40,message,&local_60);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)this = &PTR__SocketBindException_0018c948;
  return;
}

Assistant:

explicit SocketBindException(const char* message, int error) : std::runtime_error(message + std::to_string(error)) {}